

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eepromtool.c
# Opt level: O3

void eepromtool(char *ifname,int slave,int mode,char *fname)

{
  byte bVar1;
  undefined2 uVar2;
  char cVar3;
  byte bVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  int i_1;
  uint length;
  char *pcVar8;
  int i;
  uint uVar9;
  uint8 *puVar10;
  bool bVar11;
  timeval tVar12;
  int estart;
  int w;
  uint local_3c;
  int local_38 [2];
  
  iVar5 = ec_init();
  if (iVar5 == 0) {
    printf("No socket connection on %s\nExcecute as root\n",ifname);
    return;
  }
  printf("ec_init on %s succeeded.\n",ifname);
  local_38[1] = 0;
  wkc = ec_BRD(0,0,4,local_38 + 1,20000);
  if (wkc < 1) {
    pcVar8 = "No slaves found!";
  }
  else {
    _ec_slavecount = wkc;
    printf("%d slaves found.\n");
    if ((slave < 1) || (_ec_slavecount < slave)) {
      pcVar8 = "Slave number outside range.";
    }
    else {
      if (((uint)mode < 7) && ((0x46U >> (mode & 0x1fU) & 1) != 0)) {
        iVar5 = 0;
        gettimeofday((timeval *)&tstart,(__timezone_ptr_t)0x0);
        eeprom_read(slave,0,0x80);
        printf("Slave %d data\n",slave);
        puVar10 = ebuf;
        printf(" PDI Control      : %4.4X\n",(ulong)(ushort)ebuf._0_2_);
        printf(" PDI Config       : %4.4X\n",(ulong)(ushort)ebuf._2_2_);
        printf(" Config Alias     : %4.4X\n",(ulong)(ushort)ebuf._8_2_);
        printf(" Checksum         : %4.4X\n",(ulong)(ushort)ebuf._14_2_);
        uVar6 = 0xff;
        do {
          uVar6 = (ulong)(byte)((byte)uVar6 ^ *puVar10);
          iVar7 = 8;
          do {
            uVar9 = (int)uVar6 * 2;
            cVar3 = (char)uVar6;
            uVar6 = ((ulong)uVar9 ^ 7) & 0xff;
            if (-1 < cVar3) {
              uVar6 = (ulong)(byte)uVar9;
            }
            iVar7 = iVar7 + -1;
          } while (iVar7 != 0);
          puVar10 = puVar10 + 1;
          iVar5 = iVar5 + 1;
        } while (iVar5 != 0xe);
        printf("   calculated     : %4.4X\n",uVar6);
        printf(" Vendor ID        : %8.8X\n",(ulong)(uint)ebuf._16_4_);
        printf(" Product Code     : %8.8X\n",(ulong)(uint)ebuf._20_4_);
        printf(" Revision Number  : %8.8X\n",(ulong)(uint)ebuf._24_4_);
        printf(" Serial Number    : %8.8X\n",(ulong)(uint)ebuf._28_4_);
        printf(" Mailbox Protocol : %4.4X\n",(ulong)(ushort)ebuf._56_2_);
        uVar2 = ebuf._124_2_;
        uVar9 = (uint)(ushort)ebuf._124_2_ << 7;
        if (0x7f7f < uVar9) {
          uVar9 = 0x7f80;
        }
        length = uVar9 + 0x80;
        local_3c = length;
        printf(" Size             : %4.4X = %d bytes\n",(ulong)(uint)(ushort)ebuf._124_2_,
               (ulong)length);
        printf(" Version          : %4.4X\n");
        if (1 < mode - 1U) goto LAB_00102d10;
        if (uVar2 != 0) {
          eeprom_read(slave,0x80,uVar9);
        }
        gettimeofday((timeval *)&tend,(__timezone_ptr_t)0x0);
        tdif.tv_sec = tend.tv_sec - tstart.tv_sec;
        tdif.tv_usec = tend.tv_usec - tstart.tv_usec;
        if (tdif.tv_usec < 0) {
          tdif.tv_sec = tdif.tv_sec + -1;
          tdif.tv_usec = tdif.tv_usec + 1000000;
        }
        if (mode == 2) {
          output_intelhex(fname,length);
        }
        else {
          output_bin(fname,length);
        }
        tVar12.tv_usec = tdif.tv_sec * 1000000 + tdif.tv_usec;
        pcVar8 = "\nTotal EEPROM read time :%ldms\n";
LAB_00102f38:
        printf(pcVar8,tVar12.tv_usec / 1000);
        goto LAB_00102cf0;
      }
LAB_00102d10:
      if (mode - 3U < 2) {
        local_38[0] = 0;
        if (mode == 4) {
          iVar5 = input_intelhex(fname,local_38,(int *)&local_3c);
        }
        else {
          iVar5 = input_bin(fname,(int *)&local_3c);
        }
        if (iVar5 != 0) {
          printf("Slave %d\n",slave);
          printf(" Vendor ID        : %8.8X\n",(ulong)(uint)ebuf._16_4_);
          printf(" Product Code     : %8.8X\n",(ulong)(uint)ebuf._20_4_);
          printf(" Revision Number  : %8.8X\n",(ulong)(uint)ebuf._24_4_);
          printf(" Serial Number    : %8.8X\n");
          printf("Busy");
          fflush(_stdout);
          gettimeofday((timeval *)&tstart,(__timezone_ptr_t)0x0);
          eeprom_write(slave,local_38[0],local_3c);
          gettimeofday((timeval *)&tend,(__timezone_ptr_t)0x0);
          tVar12.tv_sec = tend.tv_sec - tstart.tv_sec;
          tVar12.tv_usec = tend.tv_usec - tstart.tv_usec;
          tdif = tVar12;
          if (tVar12.tv_usec < 0) {
            tVar12.tv_sec = tVar12.tv_sec + -1;
            tVar12.tv_usec = tVar12.tv_usec + 1000000;
            tdif.tv_usec = tVar12.tv_usec;
            tdif.tv_sec = tVar12.tv_sec;
          }
          tVar12.tv_usec = tVar12.tv_sec * 1000000 + tVar12.tv_usec;
          pcVar8 = "\nTotal EEPROM write time :%ldms\n";
          goto LAB_00102f38;
        }
        pcVar8 = "Error reading file, abort.";
      }
      else {
        if (mode != 5) goto LAB_00102cf0;
        iVar7 = 0;
        iVar5 = eeprom_read(slave,0,0xe);
        if (iVar5 == 0) {
          printf("Could not read slave EEPROM");
          goto LAB_00102cf0;
        }
        ebuf._8_2_ = (undefined2)alias;
        bVar4 = 0xff;
        puVar10 = ebuf;
        do {
          bVar4 = bVar4 ^ *puVar10;
          iVar5 = 8;
          do {
            bVar1 = bVar4 * '\x02';
            bVar11 = -1 < (char)bVar4;
            bVar4 = bVar1 ^ 7;
            if (bVar11) {
              bVar4 = bVar1;
            }
            iVar5 = iVar5 + -1;
          } while (iVar5 != 0);
          puVar10 = puVar10 + 1;
          iVar7 = iVar7 + 1;
        } while (iVar7 != 0xe);
        iVar5 = eeprom_writealias(slave,alias,(ushort)bVar4);
        if (iVar5 != 0) {
          printf("Alias %4.4X written successfully to slave %d\n",(ulong)(uint)alias,slave);
          goto LAB_00102cf0;
        }
        pcVar8 = "Alias not written";
      }
    }
  }
  puts(pcVar8);
LAB_00102cf0:
  puts("End, close socket");
  ec_close();
  return;
}

Assistant:

void eepromtool(char *ifname, int slave, int mode, char *fname)
{
   int w, rc = 0, estart, esize;
   uint16 *wbuf;
   
   /* initialise SOEM, bind socket to ifname */
   if (ec_init(ifname))
   {   
      printf("ec_init on %s succeeded.\n",ifname);

      w = 0x0000;
       wkc = ec_BRD(0x0000, ECT_REG_TYPE, sizeof(w), &w, EC_TIMEOUTSAFE);      /* detect number of slaves */
       if (wkc > 0)
       {
         ec_slavecount = wkc;

         printf("%d slaves found.\n",ec_slavecount);
         if((ec_slavecount >= slave) && (slave > 0))
         {
            if ((mode == MODE_INFO) || (mode == MODE_READBIN) || (mode == MODE_READINTEL))
            {
               rc =  gettimeofday(&tstart, NULL);
               eeprom_read(slave, 0x0000, MINBUF); // read first 128 bytes

               wbuf = (uint16 *)&ebuf[0];
               printf("Slave %d data\n", slave);
               printf(" PDI Control      : %4.4X\n",*(wbuf + 0x00));
               printf(" PDI Config       : %4.4X\n",*(wbuf + 0x01));
               printf(" Config Alias     : %4.4X\n",*(wbuf + 0x04));
               printf(" Checksum         : %4.4X\n",*(wbuf + 0x07));
               printf("   calculated     : %4.4X\n",SIIcrc(&ebuf[0])); 
               printf(" Vendor ID        : %8.8X\n",*(uint32 *)(wbuf + 0x08));
               printf(" Product Code     : %8.8X\n",*(uint32 *)(wbuf + 0x0A));
               printf(" Revision Number  : %8.8X\n",*(uint32 *)(wbuf + 0x0C));
               printf(" Serial Number    : %8.8X\n",*(uint32 *)(wbuf + 0x0E));
               printf(" Mailbox Protocol : %4.4X\n",*(wbuf + 0x1C));
               esize = (*(wbuf + 0x3E) + 1) * 128;
               if (esize > MAXBUF) esize = MAXBUF;
               printf(" Size             : %4.4X = %d bytes\n",*(wbuf + 0x3E), esize);
               printf(" Version          : %4.4X\n",*(wbuf + 0x3F));
            }
            if ((mode == MODE_READBIN) || (mode == MODE_READINTEL))
            {
               if (esize > MINBUF)
                  eeprom_read(slave, MINBUF, esize - MINBUF); // read reminder

               rc =  gettimeofday(&tend, NULL);
               timersub(&tend, &tstart, &tdif);
               if (mode == MODE_READINTEL) output_intelhex(fname, esize);
               if (mode == MODE_READBIN)   output_bin(fname, esize);

               printf("\nTotal EEPROM read time :%ldms\n", (tdif.tv_usec+(tdif.tv_sec*1000000L)) / 1000);
            }
            if ((mode == MODE_WRITEBIN) || (mode == MODE_WRITEINTEL))
            {
               estart = 0;
               if (mode == MODE_WRITEINTEL) rc = input_intelhex(fname, &estart, &esize);
               if (mode == MODE_WRITEBIN)   rc = input_bin(fname, &esize);

               if (rc > 0)
               {               
                  wbuf = (uint16 *)&ebuf[0];
                  printf("Slave %d\n", slave);
                  printf(" Vendor ID        : %8.8X\n",*(uint32 *)(wbuf + 0x08));
                  printf(" Product Code     : %8.8X\n",*(uint32 *)(wbuf + 0x0A));
                  printf(" Revision Number  : %8.8X\n",*(uint32 *)(wbuf + 0x0C));
                  printf(" Serial Number    : %8.8X\n",*(uint32 *)(wbuf + 0x0E));

                  printf("Busy");
                  fflush(stdout);
                  rc =  gettimeofday(&tstart, NULL);
                  eeprom_write(slave, estart, esize);
                  rc =  gettimeofday(&tend, NULL);               
                  timersub(&tend, &tstart, &tdif);

                  printf("\nTotal EEPROM write time :%ldms\n", (tdif.tv_usec+(tdif.tv_sec*1000000L)) / 1000);
               }
               else
                  printf("Error reading file, abort.\n"); 
            }
            if (mode == MODE_WRITEALIAS)
            {
               if( eeprom_read(slave, 0x0000, CRCBUF) ) // read first 14 bytes
               {
                  wbuf = (uint16 *)&ebuf[0];
                  *(wbuf + 0x04) = alias;  
                  if(eeprom_writealias(slave, alias, SIIcrc(&ebuf[0])))
                  {
                     printf("Alias %4.4X written successfully to slave %d\n", alias, slave);
                  } 
                  else
                  {
                     printf("Alias not written\n");
                  }
               }  
               else
               {
                  printf("Could not read slave EEPROM");    
               }
            }
         }
         else
         {
            printf("Slave number outside range.\n");
         }
      }
      else
      {
         printf("No slaves found!\n");
      }
      printf("End, close socket\n");
      /* stop SOEM, close socket */
      ec_close();
   }
   else
   {
      printf("No socket connection on %s\nExcecute as root\n",ifname);
   }
}